

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzio.c
# Opt level: O3

int luaZ_fill(ZIO *z)

{
  int iVar1;
  lua_State *plVar2;
  int *piVar3;
  size_t in_RAX;
  byte *pbVar4;
  uint uVar5;
  size_t size;
  size_t local_18;
  
  plVar2 = z->L;
  piVar3 = *(int **)&plVar2[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lzio.c"
                  ,0x1b,"int luaZ_fill(ZIO *)");
  }
  local_18 = in_RAX;
  pbVar4 = (byte *)(*z->reader)(plVar2,z->data,&local_18);
  iVar1 = **(int **)&plVar2[-1].hookmask;
  **(int **)&plVar2[-1].hookmask = iVar1 + 1;
  if (iVar1 == 0) {
    uVar5 = 0xffffffff;
    if (local_18 != 0 && pbVar4 != (byte *)0x0) {
      z->n = local_18 - 1;
      z->p = (char *)(pbVar4 + 1);
      uVar5 = (uint)*pbVar4;
    }
    return uVar5;
  }
  __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lzio.c"
                ,0x1d,"int luaZ_fill(ZIO *)");
}

Assistant:

int luaZ_fill (ZIO *z) {
  size_t size;
  lua_State *L = z->L;
  const char *buff;
  lua_unlock(L);
  buff = z->reader(L, z->data, &size);
  lua_lock(L);
  if (buff == NULL || size == 0)
    return EOZ;
  z->n = size - 1;  /* discount char being returned */
  z->p = buff;
  return cast_uchar(*(z->p++));
}